

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckPrimaryKeyExists
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  bool bVar2;
  allocator local_c9;
  string local_c8;
  string local_a8;
  char *local_88;
  char *message;
  PatternType pattern_type;
  allocator local_69;
  string local_68 [8];
  string title;
  regex pattern;
  bool create_statement;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  bVar2 = IsCreateStatement(sql_statement);
  if (bVar2) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               "(primary key)",0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Primary Key Does Not Exist",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    message._0_4_ = 2;
    local_88 = anon_var_dwarf_5a5e0;
    std::__cxx11::string::string((string *)&local_a8,local_68);
    pcVar1 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar1,&local_c9);
    CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
                 RISK_LEVEL_MEDIUM,PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_a8,&local_c8,false,0)
    ;
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  }
  return;
}

Assistant:

void CheckPrimaryKeyExists(Configuration& state,
                           const std::string& sql_statement,
                           bool& print_statement){

  auto create_statement = IsCreateStatement(sql_statement);
  if(create_statement == false){
    return;
  }

  std::regex pattern("(primary key)");
  std::string title = "Primary Key Does Not Exist";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Consider adding a primary key:  "
      "A primary key constraint is important when you need to do the following:  "
      "prevent a table from containing duplicate rows, "
      "reference individual rows in queries, and "
      "support foreign key references "
      "If you don’t use primary key constraints, you create a chore for yourself:  "
      "checking for duplicate rows. More often than not, you will need to define "
      "a primary key for every table. Use compound keys when they are appropriate.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               false);

}